

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::update_list(torrent *this,torrent_list_index_t list,bool in)

{
  link *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  char *pcVar2;
  
  this_00 = (link *)(&(((array<link,_aux::session_interface::num_torrent_lists,_torrent_list_index_t>
                         *)(&this->m_info_hash + 1))->super_array<libtorrent::aux::link,_8UL>).
                      field_0x0 + (long)list.m_val * 4);
  iVar1 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x3c])();
  if ((int)CONCAT71(in_register_00000011,in) == 0) {
    if (this_00->index < 0) {
      return;
    }
    link::unlink<libtorrent::aux::torrent>
              (this_00,(vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var,iVar1),list);
  }
  else {
    if (-1 < this_00->index) {
      return;
    }
    link::insert<libtorrent::aux::torrent>
              (this_00,(vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var,iVar1),this);
  }
  iVar1 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
  if ((char)iVar1 == '\0') {
    return;
  }
  if ((uint)list.m_val < 8) {
    pcVar2 = &DAT_003f99d8 + *(int *)(&DAT_003f99d8 + (ulong)(uint)list.m_val * 4);
  }
  else {
    pcVar2 = "";
  }
  UNRECOVERED_JUMPTABLE = (this->super_request_callback)._vptr_request_callback[7];
  (*UNRECOVERED_JUMPTABLE)(this,"*** UPDATE LIST [ %s : %d ]",pcVar2,in,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void torrent::update_list(torrent_list_index_t const list, bool in)
	{
		link& l = m_links[list];
		aux::vector<torrent*>& v = m_ses.torrent_list(list);

		if (in)
		{
			if (l.in_list()) return;
			l.insert(v, this);
		}
		else
		{
			if (!l.in_list()) return;
			l.unlink(v, list);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
			debug_log("*** UPDATE LIST [ %s : %d ]", list_name(list), int(in));
#endif
	}